

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

void __thiscall spvtools::opt::analysis::VectorConstant::~VectorConstant(VectorConstant *this)

{
  CompositeConstant::~CompositeConstant(&this->super_CompositeConstant);
  operator_delete(this,0x30);
  return;
}

Assistant:

VectorConstant(const Vector* ty)
      : CompositeConstant(ty), component_type_(ty->element_type()) {}